

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O2

int __thiscall
helics::apps::Connector::makeTargetConnection
          (Connector *this,string_view origin,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *tagList,
          unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          *possibleConnections,
          unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
          *aliases,function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                   *callback)

{
  basic_string_view<char,_std::char_traits<char>_> __args_1;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __args_1_00;
  basic_string_view<char,_std::char_traits<char>_> __args_1_01;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __args_1_02;
  bool bVar1;
  iterator iVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  int iVar5;
  int iVar6;
  unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  *puVar7;
  pointer pCVar8;
  Connection *option;
  pointer pCVar9;
  char cVar10;
  string_view target;
  string_view target_00;
  string_view target_01;
  vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_> aliasOptions;
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  aliasList;
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  interfaceAliasList;
  vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_> connectionOptions;
  int local_f4;
  vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_> local_c0;
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_a8;
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_78;
  vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_> local_48;
  
  target_00._M_len = origin._M_str;
  puVar7 = (unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
            *)tagList;
  buildPossibleConnectionList(&local_48,this,origin,tagList);
  iVar6 = 0;
  for (pCVar9 = local_48.
                super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pCVar9 != local_48.
                super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                ._M_impl.super__Vector_impl_data._M_finish; pCVar9 = pCVar9 + 1) {
    iVar2 = CLI::std::
            _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::find(&possibleConnections->_M_h,&pCVar9->interface2);
    if (iVar2.super__Node_iterator_base<std::basic_string_view<char,_std::char_traits<char>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      if ((aliases->_M_h)._M_element_count != 0) {
        target._M_str = (char *)aliases;
        target._M_len = (size_t)(pCVar9->interface2)._M_str;
        generateAliases((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                         *)&local_a8,(apps *)(pCVar9->interface2)._M_len,target,puVar7);
        for (p_Var3 = local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var3 != &local_a8._M_impl.super__Rb_tree_header;
            p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
          __y._M_len = (pCVar9->interface2)._M_len;
          __y._M_str = (pCVar9->interface2)._M_str;
          bVar1 = std::operator==(*(basic_string_view<char,_std::char_traits<char>_> *)(p_Var3 + 1),
                                  __y);
          if ((!bVar1) &&
             (iVar2 = CLI::std::
                      _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      ::find(&possibleConnections->_M_h,(key_type *)(p_Var3 + 1)),
             iVar2.
             super__Node_iterator_base<std::basic_string_view<char,_std::char_traits<char>_>,_true>.
             _M_cur != (__node_type *)0x0)) {
            puVar7 = (unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                      *)(pCVar9->interface2)._M_str;
            __args_1_00._M_len = (pCVar9->interface2)._M_len;
            __args_1_00._M_str = (pCVar9->interface2)._M_str;
            std::
            function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
            ::operator()((function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                          *)callback,(basic_string_view<char,_std::char_traits<char>_>)origin,
                         __args_1_00);
            iVar6 = iVar6 + 1;
            cVar10 = this->matchMultiple;
            if ((bool)cVar10 == false) {
              local_f4 = iVar6;
            }
            goto LAB_0023fbd1;
          }
        }
        cVar10 = '\x01';
LAB_0023fbd1:
        std::
        _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::~_Rb_tree(&local_a8);
        iVar5 = local_f4;
        goto joined_r0x0023fbe7;
      }
    }
    else {
      puVar7 = (unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                *)(pCVar9->interface2)._M_str;
      __args_1._M_len = (pCVar9->interface2)._M_len;
      __args_1._M_str = (pCVar9->interface2)._M_str;
      std::
      function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
      ::operator()((function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                    *)callback,(basic_string_view<char,_std::char_traits<char>_>)origin,__args_1);
      iVar6 = iVar6 + 1;
      cVar10 = this->matchMultiple;
      iVar5 = iVar6;
joined_r0x0023fbe7:
      if (cVar10 == '\0') goto LAB_0023fded;
    }
  }
  iVar5 = iVar6;
  if ((aliases->_M_h)._M_element_count != 0) {
    target_00._M_str = (char *)aliases;
    generateAliases((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     *)&local_a8,(apps *)origin._M_len,target_00,puVar7);
    for (p_Var3 = local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &local_a8._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      bVar1 = std::operator==(*(basic_string_view<char,_std::char_traits<char>_> *)(p_Var3 + 1),
                              (basic_string_view<char,_std::char_traits<char>_>)origin);
      if (!bVar1) {
        puVar7 = (unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                  *)tagList;
        buildPossibleConnectionList(&local_c0,this,*(string_view *)(p_Var3 + 1),tagList);
        pCVar9 = local_c0.
                 super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pCVar8 = local_c0.
                      super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                      ._M_impl.super__Vector_impl_data._M_start; pCVar8 != pCVar9;
            pCVar8 = pCVar8 + 1) {
          iVar2 = CLI::std::
                  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::find(&possibleConnections->_M_h,&pCVar8->interface2);
          if (iVar2.
              super__Node_iterator_base<std::basic_string_view<char,_std::char_traits<char>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            if ((aliases->_M_h)._M_element_count != 0) {
              target_01._M_str = (char *)aliases;
              target_01._M_len = (size_t)(pCVar8->interface2)._M_str;
              generateAliases((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                               *)&local_78,(apps *)(pCVar8->interface2)._M_len,target_01,puVar7);
              for (p_Var4 = local_78._M_impl.super__Rb_tree_header._M_header._M_left;
                  (_Rb_tree_header *)p_Var4 != &local_78._M_impl.super__Rb_tree_header;
                  p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
                __y_00._M_len = (pCVar8->interface2)._M_len;
                __y_00._M_str = (pCVar8->interface2)._M_str;
                bVar1 = std::operator==(*(basic_string_view<char,_std::char_traits<char>_> *)
                                         (p_Var3 + 1),__y_00);
                if ((!bVar1) &&
                   (iVar2 = CLI::std::
                            _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                            ::find(&possibleConnections->_M_h,(key_type *)(p_Var4 + 1)),
                   iVar2.
                   super__Node_iterator_base<std::basic_string_view<char,_std::char_traits<char>_>,_true>
                   ._M_cur != (__node_type *)0x0)) {
                  puVar7 = (unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                            *)(pCVar8->interface2)._M_str;
                  __args_1_02._M_len = (pCVar8->interface2)._M_len;
                  __args_1_02._M_str = (pCVar8->interface2)._M_str;
                  std::
                  function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                  ::operator()((function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                                *)callback,(basic_string_view<char,_std::char_traits<char>_>)origin,
                               __args_1_02);
                  iVar6 = iVar6 + 1;
                  cVar10 = this->matchMultiple;
                  if ((bool)cVar10 == false) {
                    local_f4 = iVar6;
                  }
                  goto LAB_0023fd85;
                }
              }
              cVar10 = '\x01';
LAB_0023fd85:
              std::
              _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ::~_Rb_tree(&local_78);
              iVar5 = local_f4;
              goto joined_r0x0023fda1;
            }
          }
          else {
            puVar7 = (unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                      *)(pCVar8->interface2)._M_str;
            __args_1_01._M_len = (pCVar8->interface2)._M_len;
            __args_1_01._M_str = (pCVar8->interface2)._M_str;
            std::
            function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
            ::operator()((function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                          *)callback,(basic_string_view<char,_std::char_traits<char>_>)origin,
                         __args_1_01);
            iVar6 = iVar6 + 1;
            cVar10 = this->matchMultiple;
            iVar5 = iVar6;
joined_r0x0023fda1:
            if (cVar10 == '\0') {
              CLI::std::vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
              ::~vector(&local_c0);
              std::
              _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ::~_Rb_tree(&local_a8);
              goto LAB_0023fded;
            }
          }
        }
        CLI::std::vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>::
        ~vector(&local_c0);
      }
    }
    std::
    _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::~_Rb_tree(&local_a8);
    iVar5 = iVar6;
  }
LAB_0023fded:
  CLI::std::vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>::~vector
            (&local_48);
  return iVar5;
}

Assistant:

int Connector::makeTargetConnection(
    std::string_view origin,
    const std::vector<std::size_t>& tagList,
    std::unordered_set<std::string_view>& possibleConnections,
    const std::unordered_multimap<std::string_view, std::string_view>& aliases,
    const std::function<void(std::string_view, std::string_view)>& callback)
{
    int matched{0};
    auto connectionOptions = buildPossibleConnectionList(origin, tagList);
    for (const auto& option : connectionOptions) {
        auto located = possibleConnections.find(option.interface2);
        if (located != possibleConnections.end()) {
            /* source, target*/
            callback(origin, option.interface2);
            ++matched;
            if (!matchMultiple) {
                return matched;
            }

        } else {
            if (!aliases.empty()) {
                auto aliasList = generateAliases(option.interface2, aliases);
                for (const auto& alias : aliasList) {
                    if (alias == option.interface2) {
                        continue;
                    }
                    located = possibleConnections.find(alias);
                    if (located != possibleConnections.end()) {
                        callback(origin, option.interface2);
                        ++matched;
                        if (!matchMultiple) {
                            return matched;
                        }
                        break;
                    }
                }
            }
        }
    }
    if (!aliases.empty()) {
        auto aliasList = generateAliases(origin, aliases);
        for (const auto& alias : aliasList) {
            if (alias == origin) {
                continue;
            }
            auto aliasOptions = buildPossibleConnectionList(alias, tagList);
            for (const auto& option : aliasOptions) {
                auto located = possibleConnections.find(option.interface2);
                if (located != possibleConnections.end()) {
                    /* source, target*/
                    callback(origin, option.interface2);
                    ++matched;
                    if (!matchMultiple) {
                        return matched;
                    }

                } else {
                    if (!aliases.empty()) {
                        auto interfaceAliasList = generateAliases(option.interface2, aliases);
                        for (const auto& interfaceAlias : interfaceAliasList) {
                            if (alias == option.interface2) {
                                continue;
                            }
                            located = possibleConnections.find(interfaceAlias);
                            if (located != possibleConnections.end()) {
                                callback(origin, option.interface2);
                                ++matched;
                                if (!matchMultiple) {
                                    return matched;
                                }
                                break;
                            }
                        }
                    }
                }
            }
        }
    }
    return matched;
}